

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O1

Cookie * Curl_cookie_add(Curl_easy *data,CookieInfo *ci,_Bool httpheader,_Bool noexpire,
                        char *lineptr,char *domain,char *path,_Bool secure)

{
  uchar *puVar1;
  char cVar2;
  curl_trc_feat *pcVar3;
  Curl_easy *easy;
  CookieInfo *pCVar4;
  byte bVar5;
  _Bool _Var6;
  char cVar7;
  _Bool _Var8;
  CURLofft CVar9;
  int iVar10;
  Cookie *pCVar11;
  size_t sVar12;
  size_t sVar13;
  void *pvVar14;
  char *pcVar15;
  time_t tVar16;
  long lVar17;
  size_t sVar18;
  psl_ctx_t *ppVar19;
  size_t sVar20;
  undefined7 in_register_00000009;
  char *pcVar21;
  curl_off_t *pcVar22;
  char *__s1;
  size_t __n;
  curl_off_t *pcVar23;
  int iVar24;
  bool bVar25;
  bool bVar26;
  _Bool replaces;
  Cookie *local_290;
  curl_off_t *local_288;
  char local_279;
  Curl_easy *local_278;
  char *local_270;
  int local_264;
  CookieInfo *local_260;
  undefined4 local_254;
  curl_off_t *local_250;
  time_t local_248;
  long local_240;
  char lcase [256];
  char local_138 [264];
  
  replaces = false;
  if (0x31 < (data->req).setcookies) {
    return (Cookie *)0x0;
  }
  local_254 = (undefined4)CONCAT71(in_register_00000009,noexpire);
  pCVar11 = (Cookie *)(*Curl_ccalloc)(1,0x78);
  if (pCVar11 == (Cookie *)0x0) {
    return (Cookie *)0x0;
  }
  local_290 = pCVar11;
  local_278 = data;
  local_260 = ci;
  if (httpheader) {
    sVar12 = strlen(lineptr);
    if (sVar12 < 0x1389) {
      local_270 = domain;
      local_248 = time((time_t *)0x0);
      local_250 = &pCVar11->expires;
      local_240 = 0x7fffffffffffffff - local_248;
      do {
        for (; (cVar7 = (char)*(curl_off_t *)lineptr, cVar7 == ' ' || (cVar7 == '\t'));
            lineptr = (char *)((long)lineptr + 1)) {
        }
        sVar12 = strcspn(lineptr,";\t\r\n=");
        if (sVar12 == 0) {
LAB_0011eb6c:
          for (; (cVar2 = (char)*(curl_off_t *)lineptr, cVar2 == ' ' || (cVar2 == '\t'));
              lineptr = (char *)((long)lineptr + 1)) {
          }
          cVar7 = (cVar2 != ';') * '\x02';
          lineptr = (char *)((long)lineptr + (ulong)(cVar2 == ';'));
        }
        else {
          local_288 = (curl_off_t *)(sVar12 + (long)lineptr);
          sVar18 = sVar12;
          do {
            cVar2 = *(char *)((long)lineptr + (sVar18 - 1));
            if ((cVar2 != ' ') && (cVar2 != '\t')) goto LAB_0011e5b8;
            sVar18 = sVar18 - 1;
          } while (sVar18 != 0);
          sVar18 = 0;
LAB_0011e5b8:
          cVar2 = (char)*local_288;
          pcVar21 = (char *)0x0;
          __n = 0;
          if (cVar2 == '=') {
            pcVar21 = (char *)((long)lineptr + sVar12 + 1);
            local_279 = cVar2;
            sVar13 = strcspn(pcVar21,";\r\n");
            __n = sVar13;
            if (sVar13 != 0) {
              do {
                cVar2 = *(char *)((long)lineptr + __n + sVar12);
                if ((cVar2 != ' ') && (cVar2 != '\t')) goto LAB_0011e616;
                __n = __n - 1;
              } while (__n != 0);
              __n = 0;
            }
LAB_0011e616:
            if (__n != 0) {
              do {
                if ((*pcVar21 != ' ') && (*pcVar21 != '\t')) goto LAB_0011e635;
                pcVar21 = pcVar21 + 1;
                __n = __n - 1;
              } while (__n != 0);
              __n = 0;
            }
LAB_0011e635:
            local_288 = (curl_off_t *)((long)lineptr + sVar12 + sVar13 + 1);
            pvVar14 = memchr(pcVar21,9,__n);
            cVar2 = local_279;
            if (pvVar14 == (void *)0x0) goto LAB_0011e68a;
            iVar10 = 2;
            iVar24 = 2;
            if (local_278 == (Curl_easy *)0x0) goto LAB_0011e970;
            pcVar23 = local_288;
            if ((((local_278->set).field_0x8cd & 0x10) == 0) ||
               ((pcVar3 = (local_278->state).feat, pcVar3 != (curl_trc_feat *)0x0 &&
                (pcVar3->log_level < 1)))) {
LAB_0011e67e:
              bVar26 = false;
              lineptr = (char *)pcVar23;
            }
            else {
              pcVar21 = "cookie contains TAB, dropping";
              iVar10 = iVar24;
LAB_0011e903:
              bVar26 = false;
              Curl_infof(local_278,pcVar21);
              lineptr = (char *)pcVar23;
              iVar24 = iVar10;
            }
          }
          else {
LAB_0011e68a:
            if (((sVar18 < 0xfff) && (__n < 0xfff)) && (sVar18 + __n < 0x1001)) {
              if ((cVar7 == '_' && 6 < sVar18) && (*(char *)((long)lineptr + 1) == '_')) {
                iVar10 = curl_strnequal("__Secure-",lineptr,9);
                bVar5 = 0x10;
                if (iVar10 == 0) {
                  iVar10 = curl_strnequal("__Host-",lineptr,7);
                  bVar5 = 0x20;
                  if (iVar10 == 0) goto LAB_0011e70e;
                }
                local_290->field_0x74 = local_290->field_0x74 | bVar5;
              }
LAB_0011e70e:
              if (local_290->name != (char *)0x0) {
                if (__n == 0) {
                  if (sVar18 == 8) {
                    iVar10 = curl_strnequal("httponly",lineptr,8);
                    if (iVar10 == 0) goto LAB_0011eb41;
                    local_290->field_0x74 = local_290->field_0x74 | 8;
                    pcVar23 = local_288;
                  }
                  else if ((sVar18 == 6) &&
                          (iVar10 = curl_strnequal("secure",lineptr,6), iVar10 != 0)) {
                    if ((!secure) && (local_260->running != false)) {
                      iVar10 = 8;
                      goto LAB_0011e970;
                    }
                    local_290->field_0x74 = local_290->field_0x74 | 2;
                    pcVar23 = local_288;
                  }
                  else {
LAB_0011eb41:
                    pcVar23 = local_288;
                    if (cVar2 == '=') goto LAB_0011e729;
                  }
                }
                else {
LAB_0011e729:
                  if (sVar18 == 7) {
                    iVar10 = curl_strnequal("version",lineptr,7);
                    pcVar23 = local_288;
                    if (iVar10 == 0) {
                      iVar10 = curl_strnequal("max-age",lineptr,7);
                      pcVar22 = local_250;
                      pcVar23 = local_288;
                      if (iVar10 == 0) {
                        iVar10 = curl_strnequal("expires",lineptr,7);
                        pcVar22 = local_250;
                        if ((iVar10 != 0) && (*local_250 == 0)) {
                          tVar16 = Curl_getdate_capped(pcVar21);
                          *pcVar22 = tVar16;
                          if (tVar16 == 0) goto LAB_0011ec24;
                          if (tVar16 < 0) {
                            *pcVar22 = 0;
                          }
                        }
                      }
                      else {
                        CVar9 = curlx_strtoofft(pcVar21 + (*pcVar21 == '\"'),(char **)0x0,10,
                                                local_250);
                        if (CVar9 == CURL_OFFT_OK) {
                          lVar17 = *pcVar22;
                          if (lVar17 == 0) goto LAB_0011ec24;
                          if (local_240 < lVar17) goto LAB_0011ec12;
                          lVar17 = lVar17 + local_248;
                        }
                        else {
                          if (CVar9 == CURL_OFFT_INVAL) {
LAB_0011ec24:
                            *pcVar22 = 1;
                            goto LAB_0011eb4f;
                          }
                          if (CVar9 != CURL_OFFT_FLOW) goto LAB_0011eb4f;
LAB_0011ec12:
                          lVar17 = 0x7fffffffffffffff;
                        }
                        *pcVar22 = lVar17;
                      }
                    }
                  }
                  else if (sVar18 == 6) {
                    iVar10 = curl_strnequal("domain",lineptr,6);
                    pcVar15 = local_270;
                    pcVar23 = local_288;
                    if ((__n != 0) && (iVar10 != 0)) {
                      __s1 = pcVar21 + (*pcVar21 == '.');
                      sVar20 = __n - (*pcVar21 == '.');
                      pcVar21 = local_270;
                      if (local_270 == (char *)0x0) {
                        pcVar21 = __s1;
                      }
                      _Var8 = Curl_host_is_ipnum(pcVar21);
                      if (pcVar15 == (char *)0x0) {
LAB_0011ea27:
                        pCVar11 = local_290;
                        (*Curl_cfree)(local_290->domain);
                        pcVar21 = (char *)Curl_memdup0(__s1,sVar20);
                        pCVar11->domain = pcVar21;
                        bVar25 = pcVar21 == (char *)0x0;
                        bVar26 = !bVar25;
                        iVar24 = local_264;
                        if (bVar25) {
                          iVar24 = 9;
                        }
                        pcVar23 = local_288;
                        if (!bVar25 && !_Var8) {
                          local_290->field_0x74 = local_290->field_0x74 | 1;
                          bVar26 = true;
                          iVar24 = local_264;
                        }
                      }
                      else {
                        if (_Var8) {
                          iVar10 = strncmp(__s1,local_270,sVar20);
                          if ((iVar10 == 0) && (sVar12 = strlen(local_270), sVar20 == sVar12))
                          goto LAB_0011ea27;
                          if (!_Var8) goto LAB_0011ea0f;
                        }
                        else {
LAB_0011ea0f:
                          _Var6 = cookie_tailmatch(__s1,sVar20,local_270);
                          if (_Var6) goto LAB_0011ea27;
                        }
                        pcVar23 = local_288;
                        iVar24 = 10;
                        if (local_278 == (Curl_easy *)0x0) {
                          bVar26 = false;
                        }
                        else if ((((local_278->set).field_0x8cd & 0x10) == 0) ||
                                ((pcVar3 = (local_278->state).feat, pcVar3 != (curl_trc_feat *)0x0
                                 && (pcVar3->log_level < 1)))) {
                          bVar26 = false;
                        }
                        else {
                          bVar26 = false;
                          Curl_infof(local_278,"skipped cookie with bad tailmatch domain: %s",__s1);
                        }
                      }
                      local_264 = iVar24;
                      if (!bVar26) goto LAB_0011e67e;
                    }
                  }
                  else {
                    pcVar23 = local_288;
                    if ((sVar18 == 4) &&
                       (iVar10 = curl_strnequal("path",lineptr,4), pCVar11 = local_290,
                       pcVar23 = local_288, iVar10 != 0)) {
                      (*Curl_cfree)(local_290->path);
                      pcVar21 = (char *)Curl_memdup0(pcVar21,__n);
                      pCVar11->path = pcVar21;
                      iVar10 = 9;
                      iVar24 = 9;
                      if (pcVar21 == (char *)0x0) goto LAB_0011e970;
                      (*Curl_cfree)(pCVar11->spath);
                      pcVar21 = sanitize_cookie_path(pCVar11->path);
                      pCVar11->spath = pcVar21;
                      pcVar23 = local_288;
                      if (pcVar21 == (char *)0x0) goto LAB_0011e67e;
                    }
                  }
                }
LAB_0011eb4f:
                bVar26 = true;
                lineptr = (char *)pcVar23;
                iVar24 = local_264;
                goto LAB_0011eb56;
              }
              if (cVar2 == '=') {
                (*Curl_cfree)((void *)0x0);
                pcVar15 = (char *)Curl_memdup0(lineptr,sVar18);
                pCVar11 = local_290;
                local_290->name = pcVar15;
                (*Curl_cfree)(local_290->value);
                pcVar15 = (char *)Curl_memdup0(pcVar21,__n);
                pcVar23 = local_288;
                pCVar11->value = pcVar15;
                pcVar21 = pCVar11->name;
                bVar26 = false;
                iVar24 = 6;
                iVar10 = 6;
                if (pcVar21 != (char *)0x0) {
                  lineptr = (char *)local_288;
                  if (pcVar15 == (char *)0x0) goto LAB_0011eb56;
                  sVar12 = strcspn(pcVar15,invalid_octets_badoctets);
                  if ((pcVar15[sVar12] != '\0') ||
                     (sVar12 = strcspn(pcVar21,invalid_octets_badoctets), pcVar21[sVar12] != '\0'))
                  {
                    iVar10 = 7;
                    iVar24 = 7;
                    if (((local_278 == (Curl_easy *)0x0) ||
                        (((local_278->set).field_0x8cd & 0x10) == 0)) ||
                       ((pcVar3 = (local_278->state).feat, pcVar3 != (curl_trc_feat *)0x0 &&
                        (pcVar3->log_level < 1)))) goto LAB_0011e67e;
                    pcVar21 = "invalid octets in name/value, cookie dropped";
                    goto LAB_0011e903;
                  }
                  goto LAB_0011eb4f;
                }
              }
              else {
                iVar10 = 5;
              }
            }
            else {
              iVar10 = 3;
              if (((local_278 != (Curl_easy *)0x0) && (((local_278->set).field_0x8cd & 0x10) != 0))
                 && ((pcVar3 = (local_278->state).feat, pcVar3 == (curl_trc_feat *)0x0 ||
                     (0 < pcVar3->log_level)))) {
                Curl_infof(local_278,"oversized cookie dropped, name/val %zu + %zu bytes",sVar18,__n
                          );
                iVar10 = 3;
              }
            }
LAB_0011e970:
            bVar26 = false;
            lineptr = (char *)local_288;
            iVar24 = iVar10;
          }
LAB_0011eb56:
          cVar7 = '\x01';
          local_264 = iVar24;
          if (bVar26) goto LAB_0011eb6c;
        }
        iVar10 = local_264;
        domain = local_270;
        data = local_278;
        pCVar11 = local_290;
      } while (cVar7 == '\0');
      if (cVar7 == '\x02') {
        if ((local_270 != (char *)0x0) && (local_290->domain == (char *)0x0)) {
          pcVar21 = (*Curl_cstrdup)(local_270);
          pCVar11->domain = pcVar21;
          if (pcVar21 == (char *)0x0) goto LAB_0011e217;
        }
        if ((path != (char *)0x0) && (pCVar11->path == (char *)0x0)) {
          pcVar21 = strchr(path,0x3f);
          if (pcVar21 == (char *)0x0) {
            pcVar21 = strrchr(path,0x2f);
          }
          else {
            pcVar21 = (char *)memrchr(path,0x2f,(long)pcVar21 - (long)path);
          }
          if (pcVar21 == (char *)0x0) {
            bVar26 = true;
          }
          else {
            pcVar21 = (char *)Curl_memdup0(path,(size_t)(pcVar21 + (1 - (long)path)));
            pCVar11->path = pcVar21;
            if (pcVar21 == (char *)0x0) {
              iVar10 = 9;
              bVar26 = false;
            }
            else {
              pcVar21 = sanitize_cookie_path(pcVar21);
              pCVar11->spath = pcVar21;
              bVar26 = pcVar21 != (char *)0x0;
              if (!bVar26) {
                iVar10 = 9;
              }
            }
          }
          if (!bVar26) goto LAB_0011ed6a;
        }
        iVar10 = 1;
        if (pCVar11->name != (char *)0x0) {
          puVar1 = &(data->req).setcookies;
          *puVar1 = *puVar1 + '\x01';
          iVar10 = 0;
        }
      }
    }
    else {
LAB_0011e217:
      iVar10 = 1;
    }
  }
  else {
    lcase[0] = '\0';
    lcase[1] = '\0';
    lcase[2] = '\0';
    lcase[3] = '\0';
    lcase[4] = '\0';
    lcase[5] = '\0';
    lcase[6] = '\0';
    lcase[7] = '\0';
    iVar10 = strncmp(lineptr,"#HttpOnly_",10);
    if (iVar10 == 0) {
      lineptr = lineptr + 10;
      pCVar11->field_0x74 = pCVar11->field_0x74 | 8;
    }
    data = local_278;
    pCVar11 = local_290;
    iVar10 = 0xb;
    local_270 = domain;
    if (*lineptr != '#') {
      pcVar21 = strchr(lineptr,0xd);
      if (pcVar21 != (char *)0x0) {
        *pcVar21 = '\0';
      }
      pcVar21 = strchr(lineptr,10);
      pCVar11 = local_290;
      if (pcVar21 != (char *)0x0) {
        *pcVar21 = '\0';
      }
      pcVar21 = strtok_r(lineptr,"\t",(char **)lcase);
      if (pcVar21 == (char *)0x0) {
        iVar24 = 0;
      }
      else {
        local_288 = &pCVar11->expires;
        iVar24 = 0;
        do {
          switch(iVar24) {
          case 0:
            pcVar21 = (*Curl_cstrdup)(pcVar21 + (*pcVar21 == '.'));
            local_290->domain = pcVar21;
            iVar24 = 0;
            goto LAB_0011e432;
          case 1:
            iVar10 = curl_strequal(pcVar21,"TRUE");
            bVar5 = local_290->field_0x74 & 0xfe | iVar10 != 0;
            iVar24 = 1;
            pCVar11 = local_290;
            goto LAB_0011e50d;
          case 2:
            iVar10 = strcmp("TRUE",pcVar21);
            if ((iVar10 == 0) || (iVar10 = strcmp("FALSE",pcVar21), iVar10 == 0)) {
              pcVar15 = (*Curl_cstrdup)("/");
              pCVar11 = local_290;
              local_290->path = pcVar15;
              data = local_278;
              domain = local_270;
              iVar10 = 9;
              if (pcVar15 != (char *)0x0) {
                pcVar15 = (*Curl_cstrdup)("/");
                pCVar11->spath = pcVar15;
                data = local_278;
                domain = local_270;
                pCVar11 = local_290;
                if (pcVar15 != (char *)0x0) goto switchD_0011e2e3_caseD_3;
              }
              goto LAB_0011ed6a;
            }
            pcVar21 = (*Curl_cstrdup)(pcVar21);
            pCVar11 = local_290;
            local_290->path = pcVar21;
            data = local_278;
            domain = local_270;
            iVar10 = 9;
            if (pcVar21 == (char *)0x0) goto LAB_0011ed6a;
            pcVar21 = sanitize_cookie_path(pcVar21);
            pCVar11->spath = pcVar21;
            iVar24 = 2;
            data = local_278;
            domain = local_270;
            pCVar11 = local_290;
            if (pcVar21 == (char *)0x0) goto LAB_0011ed6a;
            break;
          case 3:
switchD_0011e2e3_caseD_3:
            local_290->field_0x74 = local_290->field_0x74 & 0xfd;
            iVar10 = curl_strequal(pcVar21,"TRUE");
            if (iVar10 != 0) {
              if ((secure) || (local_260->running == true)) {
                bVar5 = local_290->field_0x74 | 2;
                iVar24 = 3;
                pCVar11 = local_290;
                goto LAB_0011e50d;
              }
              data = local_278;
              domain = local_270;
              pCVar11 = local_290;
              iVar10 = 8;
              goto LAB_0011ed6a;
            }
            iVar24 = 3;
            break;
          case 4:
            CVar9 = curlx_strtoofft(pcVar21,(char **)0x0,10,local_288);
            iVar24 = 4;
            if (CVar9 != CURL_OFFT_OK) {
              data = local_278;
              domain = local_270;
              pCVar11 = local_290;
              iVar10 = 0xc;
              goto LAB_0011ed6a;
            }
            break;
          case 5:
            pcVar21 = (*Curl_cstrdup)(pcVar21);
            local_290->name = pcVar21;
            if (pcVar21 == (char *)0x0) goto LAB_0011ed56;
            iVar10 = curl_strnequal("__Secure-",pcVar21,9);
            pCVar11 = local_290;
            if (iVar10 == 0) {
              iVar10 = curl_strnequal("__Host-",local_290->name,7);
              if (iVar10 == 0) {
                iVar24 = 5;
                break;
              }
              bVar5 = pCVar11->field_0x74 | 0x20;
            }
            else {
              bVar5 = local_290->field_0x74 | 0x10;
            }
            iVar24 = 5;
LAB_0011e50d:
            pCVar11->field_0x74 = bVar5;
            break;
          case 6:
            pcVar21 = (*Curl_cstrdup)(pcVar21);
            local_290->value = pcVar21;
            iVar24 = 6;
LAB_0011e432:
            if (pcVar21 == (char *)0x0) goto LAB_0011ed56;
          }
          pcVar21 = strtok_r((char *)0x0,"\t",(char **)lcase);
          iVar24 = iVar24 + 1;
        } while (pcVar21 != (char *)0x0);
      }
      if (iVar24 == 6) {
        pcVar21 = (*Curl_cstrdup)("");
        local_290->value = pcVar21;
        iVar24 = 7;
        if (pcVar21 == (char *)0x0) {
LAB_0011ed56:
          data = local_278;
          domain = local_270;
          pCVar11 = local_290;
          iVar10 = 9;
          goto LAB_0011ed6a;
        }
      }
      data = local_278;
      domain = local_270;
      pCVar11 = local_290;
      iVar10 = 0xd;
      if (iVar24 == 7) {
        iVar10 = 0;
      }
    }
  }
LAB_0011ed6a:
  if ((((iVar10 == 0) && (bVar5 = pCVar11->field_0x74, (bVar5 & 0x12) != 0x10)) &&
      (((bVar5 & 0x20) == 0 ||
       (((((bVar5 & 2) != 0 && (pCVar11->path != (char *)0x0)) &&
         (iVar10 = strcmp(pCVar11->path,"/"), (bVar5 & 1) == 0)) && (iVar10 == 0)))))) &&
     (((local_260->running != false || (local_260->newsession != true)) || (pCVar11->expires != 0)))
     ) {
    pCVar11->field_0x74 = bVar5 & 0xfb | local_260->running << 2;
    iVar10 = local_260->lastct + 1;
    local_260->lastct = iVar10;
    pCVar11->creationtime = iVar10;
    if ((char)local_254 == '\0') {
      remove_expired(local_260);
    }
    if (((domain != (char *)0x0 && data != (Curl_easy *)0x0) && (pCVar11->domain != (char *)0x0)) &&
       (_Var8 = Curl_host_is_ipnum(pCVar11->domain), !_Var8)) {
      local_270 = domain;
      sVar12 = strlen(domain);
      sVar18 = strlen(pCVar11->domain);
      easy = local_278;
      bVar26 = false;
      if ((sVar12 < 0x100) && (sVar18 < 0x100)) {
        ppVar19 = Curl_psl_use(local_278);
        if (ppVar19 == (psl_ctx_t *)0x0) {
          if ((((easy->set).field_0x8cd & 0x10) == 0) ||
             ((pcVar3 = (easy->state).feat, pcVar3 != (curl_trc_feat *)0x0 &&
              (pcVar3->log_level < 1)))) {
            bVar26 = false;
          }
          else {
            bVar26 = false;
            Curl_infof(local_278,"libpsl problem, rejecting cookie for satety");
          }
        }
        else {
          Curl_strntolower(lcase,local_270,sVar12 + 1);
          Curl_strntolower(local_138,local_290->domain,sVar18 + 1);
          iVar10 = psl_is_cookie_domain_acceptable(ppVar19,lcase,local_138);
          bVar26 = iVar10 != 0;
          Curl_psl_release(easy);
        }
      }
      data = local_278;
      pCVar11 = local_290;
      if (!bVar26) {
        if ((((local_278->set).field_0x8cd & 0x10) != 0) &&
           ((pcVar3 = (local_278->state).feat, pcVar3 == (curl_trc_feat *)0x0 ||
            (0 < pcVar3->log_level)))) {
          Curl_infof(local_278,
                     "cookie \'%s\' dropped, domain \'%s\' must not set cookies for \'%s\'",
                     local_290->name,local_270,local_290->domain);
          pCVar11 = local_290;
        }
        goto LAB_0011f042;
      }
    }
    iVar10 = replace_existing(data,pCVar11,local_260,secure,&replaces);
    if (iVar10 == 0) {
      sVar20 = cookiehash(pCVar11->domain);
      pCVar4 = local_260;
      Curl_llist_append(local_260->cookielist + sVar20,pCVar11,&pCVar11->node);
      if ((((data != (Curl_easy *)0x0) && (pCVar4->running != false)) &&
          (((data->set).field_0x8cd & 0x10) != 0)) &&
         ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level))))
      {
        pcVar21 = "Added";
        if (replaces != false) {
          pcVar21 = "Replaced";
        }
        Curl_infof(data,"%s cookie %s=\"%s\" for domain %s, path %s, expire %ld",pcVar21,
                   pCVar11->name,pCVar11->value,pCVar11->domain,pCVar11->path,pCVar11->expires);
      }
      if (replaces == false) {
        pCVar4->numcookies = pCVar4->numcookies + 1;
      }
      lVar17 = pCVar11->expires;
      if (lVar17 != 0) {
        if (lVar17 < pCVar4->next_expiration) {
          pCVar4->next_expiration = lVar17;
          return pCVar11;
        }
        return pCVar11;
      }
      return pCVar11;
    }
  }
LAB_0011f042:
  freecookie(pCVar11);
  return (Cookie *)0x0;
}

Assistant:

struct Cookie *
Curl_cookie_add(struct Curl_easy *data,
                struct CookieInfo *ci,
                bool httpheader, /* TRUE if HTTP header-style line */
                bool noexpire, /* if TRUE, skip remove_expired() */
                const char *lineptr,   /* first character of the line */
                const char *domain, /* default domain */
                const char *path,   /* full path used when this cookie is set,
                                       used to get default path for the cookie
                                       unless set */
                bool secure)  /* TRUE if connection is over secure origin */
{
  struct Cookie *co;
  size_t myhash;
  int rc;
  bool replaces = FALSE;

  DEBUGASSERT(data);
  DEBUGASSERT(MAX_SET_COOKIE_AMOUNT <= 255); /* counter is an unsigned char */
  if(data->req.setcookies >= MAX_SET_COOKIE_AMOUNT)
    return NULL;

  /* First, alloc and init a new struct for it */
  co = calloc(1, sizeof(struct Cookie));
  if(!co)
    return NULL; /* bail out if we are this low on memory */

  if(httpheader)
    rc = parse_cookie_header(data, co, ci, lineptr, domain, path, secure);
  else
    rc = parse_netscape(co, ci, lineptr, secure);

  if(rc)
    goto fail;

  if(co->prefix_secure && !co->secure)
    /* The __Secure- prefix only requires that the cookie be set secure */
    goto fail;

  if(co->prefix_host) {
    /*
     * The __Host- prefix requires the cookie to be secure, have a "/" path
     * and not have a domain set.
     */
    if(co->secure && co->path && strcmp(co->path, "/") == 0 && !co->tailmatch)
      ;
    else
      goto fail;
  }

  if(!ci->running &&    /* read from a file */
     ci->newsession &&  /* clean session cookies */
     !co->expires)      /* this is a session cookie since it does not expire */
    goto fail;

  co->livecookie = ci->running;
  co->creationtime = ++ci->lastct;

  /*
   * Now we have parsed the incoming line, we must now check if this supersedes
   * an already existing cookie, which it may if the previous have the same
   * domain and path as this.
   */

  /* remove expired cookies */
  if(!noexpire)
    remove_expired(ci);

  if(is_public_suffix(data, co, domain))
    goto fail;

  if(replace_existing(data, co, ci, secure, &replaces))
    goto fail;

  /* add this cookie to the list */
  myhash = cookiehash(co->domain);
  Curl_llist_append(&ci->cookielist[myhash], co, &co->node);

  if(ci->running)
    /* Only show this when NOT reading the cookies from a file */
    infof(data, "%s cookie %s=\"%s\" for domain %s, path %s, "
          "expire %" FMT_OFF_T,
          replaces ? "Replaced":"Added", co->name, co->value,
          co->domain, co->path, co->expires);

  if(!replaces)
    ci->numcookies++; /* one more cookie in the jar */

  /*
   * Now that we have added a new cookie to the jar, update the expiration
   * tracker in case it is the next one to expire.
   */
  if(co->expires && (co->expires < ci->next_expiration))
    ci->next_expiration = co->expires;

  return co;
fail:
  freecookie(co);
  return NULL;
}